

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t> __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::RpcRequest::sendForPipelineInternal(RpcRequest *this)

{
  Builder payload;
  RpcConnectionState *pRVar1;
  OutgoingRpcMessage *pOVar2;
  size_t sVar3;
  Question *this_00;
  Array<unsigned_int> *other;
  RefOrVoid<capnp::_::RpcSystemBase::RpcConnectionState> params;
  RefOrVoid<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef> other_00;
  Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t> *other_01;
  Type *func;
  QuestionRef *extraout_RDX;
  long in_RSI;
  Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t> OVar4;
  undefined1 local_178 [8];
  ContextImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_c__:2679:7)>
  _kjContext2680;
  anon_class_8_1_8991fb9c _kjContextFunc2680;
  undefined1 local_108 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_c__:2670:7)>
  _kjDefer2673;
  UnwindDetector _kjUnwindDetector2673;
  Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t> questionRef;
  Question *question;
  undefined1 local_c0 [4];
  QuestionId questionId;
  Maybe<kj::HashMap<capnp::ClientHook_*,_kj::Own<capnp::ClientHook,_std::nullptr_t>_>_&> local_a0;
  undefined1 local_98 [72];
  undefined1 local_50 [8];
  Array<unsigned_int> exports;
  Vector<int> fds;
  RpcRequest *this_local;
  
  kj::Vector<int>::Vector((Vector<int> *)&exports.disposer);
  pRVar1 = kj::Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t>::operator->
                     ((Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t> *)
                      (in_RSI + 0x10));
  local_98._40_16_ =
       (undefined1  [16])BuilderCapabilityTable::getTable((BuilderCapabilityTable *)(in_RSI + 0x40))
  ;
  rpc::Call::Builder::getParams((Builder *)local_98,(Builder *)(in_RSI + 0x68));
  kj::Maybe<kj::HashMap<capnp::ClientHook_*,_kj::Own<capnp::ClientHook,_std::nullptr_t>_>_&>::Maybe
            (&local_a0);
  payload._builder.capTable = (CapTableBuilder *)local_98._8_8_;
  payload._builder.segment = (SegmentBuilder *)local_98._0_8_;
  payload._builder.data = (void *)local_98._16_8_;
  payload._builder.pointers = (WirePointer *)local_98._24_8_;
  payload._builder.dataSize = local_98._32_4_;
  payload._builder.pointerCount = local_98._36_2_;
  payload._builder._38_2_ = local_98._38_2_;
  writeDescriptors((Array<unsigned_int> *)local_50,pRVar1,
                   (ArrayPtr<kj::Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>)
                   local_98._40_16_,payload,(Vector<int> *)&exports.disposer,&local_a0);
  pOVar2 = kj::Own<capnp::OutgoingRpcMessage,_std::nullptr_t>::operator->
                     ((Own<capnp::OutgoingRpcMessage,_std::nullptr_t> *)(in_RSI + 0x30));
  kj::Vector<int>::releaseAsArray((Array<int> *)local_c0,(Vector<int> *)&exports.disposer);
  (*pOVar2->_vptr_OutgoingRpcMessage[1])(pOVar2,local_c0);
  kj::Array<int>::~Array((Array<int> *)local_c0);
  sVar3 = kj::Array<unsigned_int>::size((Array<unsigned_int> *)local_50);
  if (sVar3 != 0) {
    pRVar1 = kj::Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t>::operator->
                       ((Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t> *)
                        (in_RSI + 0x10));
    pRVar1->sentCapabilitiesInPipelineOnlyCall = true;
  }
  pRVar1 = kj::Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t>::operator->
                     ((Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t> *)
                      (in_RSI + 0x10));
  this_00 = anon_unknown_18::
            ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::
            nextHigh(&pRVar1->questions,(uint *)((long)&question + 4));
  this_00->isAwaitingReturn = false;
  other = kj::mv<kj::Array<unsigned_int>>((Array<unsigned_int> *)local_50);
  kj::Array<unsigned_int>::operator=(&this_00->paramExports,other);
  this_00->isTailCall = false;
  params = kj::Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t>::operator*
                     ((Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t> *)
                      (in_RSI + 0x10));
  kj::
  refcounted<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,capnp::_::RpcSystemBase::RpcConnectionState&,unsigned_int&,kj::None_const&>
            ((kj *)&stack0xffffffffffffff20,params,(uint *)((long)&question + 4),(None *)&kj::none);
  other_00 = kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t>::
             operator*((Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t>
                        *)&stack0xffffffffffffff20);
  kj::Maybe<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef_&>::operator=
            (&this_00->selfRef,other_00);
  kj::UnwindDetector::UnwindDetector
            ((UnwindDetector *)((long)&_kjDefer2673.maybeFunc.ptr.field_1 + 0x14));
  _kjContextFunc2680.this = (RpcRequest *)((long)&_kjDefer2673.maybeFunc.ptr.field_1 + 0x14);
  kj::
  defer<capnp::_::RpcSystemBase::RpcConnectionState::RpcRequest::sendForPipelineInternal()::_lambda()_1_>
            ((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_c__:2670:7)>
              *)local_108,(kj *)&_kjContextFunc2680,func);
  rpc::Call::Builder::setQuestionId((Builder *)(in_RSI + 0x68),question._4_4_);
  rpc::Call::Builder::setOnlyPromisePipeline((Builder *)(in_RSI + 0x68),true);
  kj::_::Debug::
  ContextImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++:2679:7)>
  ::ContextImpl((ContextImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_c__:2679:7)>
                 *)local_178,(anon_class_8_1_8991fb9c *)&_kjContext2680.func);
  pOVar2 = kj::Own<capnp::OutgoingRpcMessage,_std::nullptr_t>::operator->
                     ((Own<capnp::OutgoingRpcMessage,_std::nullptr_t> *)(in_RSI + 0x30));
  (*pOVar2->_vptr_OutgoingRpcMessage[2])();
  other_01 = kj::
             mv<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,decltype(nullptr)>>
                       ((Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t>
                         *)&stack0xffffffffffffff20);
  kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t>::Own
            ((Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t> *)this,
             other_01);
  kj::_::Debug::
  ContextImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++:2679:7)>
  ::~ContextImpl((ContextImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_c__:2679:7)>
                  *)local_178);
  kj::_::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++:2670:7)>
  ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_c__:2670:7)>
               *)local_108);
  kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t>::~Own
            ((Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t> *)
             &stack0xffffffffffffff20);
  kj::Array<unsigned_int>::~Array((Array<unsigned_int> *)local_50);
  kj::Vector<int>::~Vector((Vector<int> *)&exports.disposer);
  OVar4.ptr = extraout_RDX;
  OVar4.disposer = (Disposer *)this;
  return OVar4;
}

Assistant:

kj::Own<QuestionRef> sendForPipelineInternal() {
      // Since must of setupSend() is subtly different for this case, we don't reuse it.

      // Build the cap table.
      kj::Vector<int> fds;
      auto exports = connectionState->writeDescriptors(
          capTable.getTable(), callBuilder.getParams(), fds);
      message->setFds(fds.releaseAsArray());

      if (exports.size() > 0) {
        connectionState->sentCapabilitiesInPipelineOnlyCall = true;
      }

      // Init the question table.  Do this after writing descriptors to avoid interference.
      QuestionId questionId;
      auto& question = connectionState->questions.nextHigh(questionId);
      question.isAwaitingReturn = false;  // No Return needed
      question.paramExports = kj::mv(exports);
      question.isTailCall = false;

      // Make the QuestionRef and result promise.
      auto questionRef = kj::refcounted<QuestionRef>(*connectionState, questionId, kj::none);
      question.selfRef = *questionRef;

      // If sending throws, we'll need to fix up the state a little...
      KJ_ON_SCOPE_FAILURE({
        question.skipFinish = true;
        connectionState->releaseExports(question.paramExports);
      });

      // Finish and send.
      callBuilder.setQuestionId(questionId);
      callBuilder.setOnlyPromisePipeline(true);

      KJ_CONTEXT("sending RPC call",
          callBuilder.getInterfaceId(), callBuilder.getMethodId());
      message->send();

      return kj::mv(questionRef);
    }